

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O0

void png_set_IHDR(png_const_structrp png_ptr,png_inforp info_ptr,png_uint_32 width,
                 png_uint_32 height,int bit_depth,int color_type,int interlace_type,
                 int compression_type,int filter_type)

{
  ulong local_30;
  int color_type_local;
  int bit_depth_local;
  png_uint_32 height_local;
  png_uint_32 width_local;
  png_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if ((png_ptr != (png_const_structrp)0x0) && (info_ptr != (png_inforp)0x0)) {
    info_ptr->width = width;
    info_ptr->height = height;
    info_ptr->bit_depth = (png_byte)bit_depth;
    info_ptr->color_type = (png_byte)color_type;
    info_ptr->compression_type = (png_byte)compression_type;
    info_ptr->filter_type = (png_byte)filter_type;
    info_ptr->interlace_type = (png_byte)interlace_type;
    png_check_IHDR(png_ptr,info_ptr->width,info_ptr->height,(uint)info_ptr->bit_depth,
                   (uint)info_ptr->color_type,(uint)info_ptr->interlace_type,
                   (uint)info_ptr->compression_type,(uint)info_ptr->filter_type);
    if (info_ptr->color_type == '\x03') {
      info_ptr->channels = '\x01';
    }
    else if ((info_ptr->color_type & 2) == 0) {
      info_ptr->channels = '\x01';
    }
    else {
      info_ptr->channels = '\x03';
    }
    if ((info_ptr->color_type & 4) != 0) {
      info_ptr->channels = info_ptr->channels + '\x01';
    }
    info_ptr->pixel_depth = info_ptr->channels * info_ptr->bit_depth;
    if (info_ptr->pixel_depth < 8) {
      local_30 = (ulong)width * (ulong)info_ptr->pixel_depth + 7 >> 3;
    }
    else {
      local_30 = (ulong)width * (ulong)(info_ptr->pixel_depth >> 3);
    }
    info_ptr->rowbytes = local_30;
  }
  return;
}

Assistant:

void PNGAPI
png_set_IHDR(png_const_structrp png_ptr, png_inforp info_ptr,
    png_uint_32 width, png_uint_32 height, int bit_depth,
    int color_type, int interlace_type, int compression_type,
    int filter_type)
{
   png_debug1(1, "in %s storage function", "IHDR");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   info_ptr->width = width;
   info_ptr->height = height;
   info_ptr->bit_depth = (png_byte)bit_depth;
   info_ptr->color_type = (png_byte)color_type;
   info_ptr->compression_type = (png_byte)compression_type;
   info_ptr->filter_type = (png_byte)filter_type;
   info_ptr->interlace_type = (png_byte)interlace_type;

   png_check_IHDR (png_ptr, info_ptr->width, info_ptr->height,
       info_ptr->bit_depth, info_ptr->color_type, info_ptr->interlace_type,
       info_ptr->compression_type, info_ptr->filter_type);

   if (info_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
      info_ptr->channels = 1;

   else if ((info_ptr->color_type & PNG_COLOR_MASK_COLOR) != 0)
      info_ptr->channels = 3;

   else
      info_ptr->channels = 1;

   if ((info_ptr->color_type & PNG_COLOR_MASK_ALPHA) != 0)
      info_ptr->channels++;

   info_ptr->pixel_depth = (png_byte)(info_ptr->channels * info_ptr->bit_depth);

   info_ptr->rowbytes = PNG_ROWBYTES(info_ptr->pixel_depth, width);
}